

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

char * flow::cstr(BinaryOperator op)

{
  char *pcStack_10;
  BinaryOperator op_local;
  
  switch(op) {
  case IAdd:
    pcStack_10 = "iadd";
    break;
  case ISub:
    pcStack_10 = "isub";
    break;
  case IMul:
    pcStack_10 = "imul";
    break;
  case IDiv:
    pcStack_10 = "idiv";
    break;
  case IRem:
    pcStack_10 = "irem";
    break;
  case IPow:
    pcStack_10 = "ipow";
    break;
  case IAnd:
    pcStack_10 = "iand";
    break;
  case IOr:
    pcStack_10 = "ior";
    break;
  case IXor:
    pcStack_10 = "ixor";
    break;
  case IShl:
    pcStack_10 = "ishl";
    break;
  case IShr:
    pcStack_10 = "ishr";
    break;
  case ICmpEQ:
    pcStack_10 = "icmpeq";
    break;
  case ICmpNE:
    pcStack_10 = "icmpne";
    break;
  case ICmpLE:
    pcStack_10 = "icmple";
    break;
  case ICmpGE:
    pcStack_10 = "icmpge";
    break;
  case ICmpLT:
    pcStack_10 = "icmplt";
    break;
  case ICmpGT:
    pcStack_10 = "icmpgt";
    break;
  case BAnd:
    pcStack_10 = "band";
    break;
  case BOr:
    pcStack_10 = "bor";
    break;
  case BXor:
    pcStack_10 = "bxor";
    break;
  case SAdd:
    pcStack_10 = "sadd";
    break;
  case SSubStr:
    pcStack_10 = "ssubstr";
    break;
  case SCmpEQ:
    pcStack_10 = "scmpeq";
    break;
  case SCmpNE:
    pcStack_10 = "scmpne";
    break;
  case SCmpLE:
    pcStack_10 = "scmple";
    break;
  case SCmpGE:
    pcStack_10 = "scmpge";
    break;
  case SCmpLT:
    pcStack_10 = "scmplt";
    break;
  case SCmpGT:
    pcStack_10 = "scmpgt";
    break;
  case SCmpRE:
    pcStack_10 = "scmpre";
    break;
  case SCmpBeg:
    pcStack_10 = "scmpbeg";
    break;
  case SCmpEnd:
    pcStack_10 = "scmpend";
    break;
  case SIn:
    pcStack_10 = "sin";
    break;
  case PCmpEQ:
    pcStack_10 = "pcmpeq";
    break;
  case PCmpNE:
    pcStack_10 = "pcmpne";
    break;
  case PInCidr:
    pcStack_10 = "pincidr";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* cstr(BinaryOperator op)  // {{{
{
  switch (op) {
    // numerical
    case BinaryOperator::IAdd: return"iadd";
    case BinaryOperator::ISub: return"isub";
    case BinaryOperator::IMul: return"imul";
    case BinaryOperator::IDiv: return"idiv";
    case BinaryOperator::IRem: return "irem";
    case BinaryOperator::IPow: return "ipow";
    case BinaryOperator::IAnd: return "iand";
    case BinaryOperator::IOr: return "ior";
    case BinaryOperator::IXor: return "ixor";
    case BinaryOperator::IShl: return "ishl";
    case BinaryOperator::IShr: return "ishr";
    case BinaryOperator::ICmpEQ: return "icmpeq";
    case BinaryOperator::ICmpNE: return "icmpne";
    case BinaryOperator::ICmpLE: return "icmple";
    case BinaryOperator::ICmpGE: return "icmpge";
    case BinaryOperator::ICmpLT: return "icmplt";
    case BinaryOperator::ICmpGT: return "icmpgt";
    // boolean
    case BinaryOperator::BAnd: return "band";
    case BinaryOperator::BOr: return "bor";
    case BinaryOperator::BXor: return "bxor";
    // string
    case BinaryOperator::SAdd: return "sadd";
    case BinaryOperator::SSubStr: return "ssubstr";
    case BinaryOperator::SCmpEQ: return "scmpeq";
    case BinaryOperator::SCmpNE: return "scmpne";
    case BinaryOperator::SCmpLE: return "scmple";
    case BinaryOperator::SCmpGE: return "scmpge";
    case BinaryOperator::SCmpLT: return "scmplt";
    case BinaryOperator::SCmpGT: return "scmpgt";
    case BinaryOperator::SCmpRE: return "scmpre";
    case BinaryOperator::SCmpBeg: return "scmpbeg";
    case BinaryOperator::SCmpEnd: return "scmpend";
    case BinaryOperator::SIn: return "sin";
    // ip
    case BinaryOperator::PCmpEQ: return "pcmpeq";
    case BinaryOperator::PCmpNE: return "pcmpne";
    case BinaryOperator::PInCidr: return "pincidr";
    default: return "?";
  };
}